

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Array<kj::_::HashBucket>::~Array(Array<kj::_::HashBucket> *this)

{
  HashBucket *pHVar1;
  size_t sVar2;
  
  pHVar1 = this->ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = this->size_;
    this->ptr = (HashBucket *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pHVar1,8,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }